

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeIncPruneBGPlanner.cpp
# Opt level: O0

VectorSet * __thiscall
TreeIncPruneBGPlanner::PruneAfterUnion(TreeIncPruneBGPlanner *this,Index depth,VectorSet *G)

{
  VectorSet *in_RDI;
  undefined4 in_stack_00000020;
  VectorSet *G1;
  
  AlphaVectorPlanning::Prune
            ((AlphaVectorPlanning *)this,(VectorSet *)CONCAT44(depth,in_stack_00000020));
  return in_RDI;
}

Assistant:

VectorSet TreeIncPruneBGPlanner::PruneAfterUnion(Index depth,
                                                 const VectorSet &G)
{
    VectorSet G1=Prune(G);
#if DEBUG_TreeIncPruneBGPlanner_KeepPruneStats
    vector<size_t> pruneStat(3);
    pruneStat[0]=depth;
    pruneStat[1]=G.size1();
    pruneStat[2]=G1.size1();
    _m_pruneAfterUnionStats.push_back(pruneStat);
#endif
    return(G1);
}